

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O1

void __thiscall QTextTable::removeRows(QTextTable *this,int pos,int num)

{
  uint *puVar1;
  long lVar2;
  QTextTablePrivate *this_00;
  QTextDocumentPrivate *this_01;
  Header *pHVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint p;
  ulong uVar11;
  uint uVar12;
  uint *puVar13;
  uint p_2;
  int iVar14;
  long lVar15;
  char *__filename;
  long lVar16;
  int iVar17;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  ConstIterator local_88;
  QList<int> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < pos && 0 < num) {
    this_00 = *(QTextTablePrivate **)&(this->super_QTextFrame).super_QTextObject.field_0x8;
    if (this_00->dirty == true) {
      QTextTablePrivate::update(this_00);
    }
    iVar7 = this_00->nRows;
    if (iVar7 - pos != 0 && pos <= iVar7) {
      iVar17 = iVar7 - pos;
      if (num + pos <= iVar7) {
        iVar17 = num;
      }
      this_01 = (this_00->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
      iVar8 = this_01->editBlock;
      this_01->editBlock = iVar8 + 1;
      if (iVar8 == 0) {
        this_01->revision = this_01->revision + 1;
      }
      if ((pos == 0) && (iVar17 == iVar7)) {
        uVar10 = (ulong)*(uint *)&(this_00->super_QTextFramePrivate).super_QTextObjectPrivate.
                                  field_0x84;
        pHVar3 = (this_01->fragments).data.field_0.head;
        lVar15 = uVar10 * 0x20;
        __filename = (char *)(ulong)*(uint *)((long)pHVar3 + lVar15 + 0x10);
        uVar12 = *(uint *)((long)pHVar3 + lVar15);
        while (uVar12 != 0) {
          uVar11 = (ulong)uVar12;
          puVar1 = (uint *)((long)pHVar3 + (ulong)uVar12 * 0x20);
          if (*(int *)((long)pHVar3 + (ulong)uVar12 * 0x20 + 8) == (int)uVar10) {
            __filename = (char *)(ulong)((int)__filename + puVar1[4] + puVar1[5]);
          }
          uVar10 = uVar11;
          uVar12 = *puVar1;
        }
        for (uVar12 = *(uint *)((long)pHVar3 +
                               (ulong)(this_00->super_QTextFramePrivate).fragment_end * 0x20);
            uVar12 != 0; uVar12 = *(uint *)((long)pHVar3 + (ulong)uVar12 * 0x20)) {
        }
        QTextDocumentPrivate::remove(this_01,__filename);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QTextDocumentPrivate::endEditBlock(this_01);
          return;
        }
        goto LAB_0053a703;
      }
      cellAt((QTextTable *)&local_58,(int)this,pos);
      iVar7 = QTextTableCell::firstPosition((QTextTableCell *)&local_58);
      cellAt((QTextTable *)&local_78,(int)this,pos + iVar17 + -1);
      iVar8 = QTextTableCell::lastPosition((QTextTableCell *)&local_78);
      QTextDocumentPrivate::aboutToRemoveCell(this_01,iVar7,iVar8);
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (int *)0x0;
      local_78.d.size = 0;
      if (0 < iVar17) {
        iVar17 = iVar17 + pos;
        do {
          iVar7 = this_00->nCols;
          if (0 < iVar7) {
            iVar8 = 0;
            do {
              uVar10 = (ulong)(iVar7 * pos + iVar8);
              piVar4 = (this_00->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this_00->grid).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <=
                  uVar10) {
                removeRows();
                goto LAB_0053a703;
              }
              uVar12 = piVar4[uVar10];
              if (local_78.d.size == 0) {
LAB_0053a413:
                uVar10 = 0xffffffffffffffff;
              }
              else {
                uVar11 = 0xfffffffffffffffc;
                do {
                  lVar15 = local_78.d.size * -4 + uVar11;
                  if (lVar15 == -4) goto LAB_0053a40d;
                  uVar10 = uVar11 + 4;
                  lVar5 = uVar11 + 4;
                  uVar11 = uVar10;
                } while (*(uint *)((long)local_78.d.ptr + lVar5) != uVar12);
                uVar10 = (long)uVar10 >> 2;
LAB_0053a40d:
                if (lVar15 == -4) goto LAB_0053a413;
              }
              if (uVar10 == 0xffffffffffffffff) {
                local_58._0_4_ = uVar12;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_78,local_78.d.size,(int *)local_58.data);
                QList<int>::end(&local_78);
                local_88._12_4_ = 0xaaaaaaaa;
                local_88.n = uVar12;
                local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                lVar15 = (ulong)uVar12 << 5;
                local_88.pt = &this_01->fragments;
                QTextFormatCollection::format
                          ((QTextFormatCollection *)&local_58,(int)this_01 + 0xe8);
                QTextFormat::toCharFormat((QTextFormat *)local_98);
                QTextFormat::~QTextFormat((QTextFormat *)&local_58);
                iVar7 = QTextFormat::intProperty((QTextFormat *)local_98,0x4810);
                iVar14 = iVar7 + (uint)(iVar7 == 0);
                if (iVar14 < 2) {
                  lVar5 = (this_00->cells).d.size;
                  if (lVar5 == 0) {
LAB_0053a51b:
                    iVar7 = -1;
                  }
                  else {
                    lVar16 = -4;
                    do {
                      iVar7 = (int)lVar15;
                      lVar2 = lVar5 * -4 + lVar16;
                      if (lVar2 == -4) goto LAB_0053a515;
                      lVar15 = lVar16 + 4;
                      lVar6 = lVar16 + 4;
                      lVar16 = lVar15;
                    } while (*(uint *)((long)(this_00->cells).d.ptr + lVar6) != uVar12);
                    iVar7 = (int)(lVar15 >> 2);
LAB_0053a515:
                    if (lVar2 == -4) goto LAB_0053a51b;
                  }
                  puVar13 = &(this_00->super_QTextFramePrivate).fragment_end;
                  if (iVar7 + 1 < lVar5) {
                    puVar13 = (uint *)((this_00->cells).d.ptr + (iVar7 + 1));
                  }
                  uVar12 = *puVar13;
                  uVar9 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  pHVar3 = (this_01->fragments).data.field_0.head;
                  for (uVar12 = *(uint *)((long)pHVar3 + (ulong)uVar12 * 0x20); uVar12 != 0;
                      uVar12 = *(uint *)((long)pHVar3 + (ulong)uVar12 * 0x20)) {
                  }
                  QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  QTextDocumentPrivate::remove(this_01,(char *)(ulong)uVar9);
                }
                else {
                  if (iVar7 == 2) {
                    QTextFormat::clearProperty((QTextFormat *)local_98,0x4810);
                  }
                  else {
                    ::QVariant::QVariant((QVariant *)&local_58,iVar14 + -1);
                    QTextFormat::setProperty((QTextFormat *)local_98,0x4810,(QVariant *)&local_58);
                    ::QVariant::~QVariant((QVariant *)&local_58);
                  }
                  iVar7 = QFragmentMap<QTextFragmentData>::ConstIterator::position(&local_88);
                  QTextDocumentPrivate::setCharFormat
                            (this_01,iVar7,1,(QTextCharFormat *)local_98,SetFormat);
                }
                QTextFormat::~QTextFormat((QTextFormat *)local_98);
              }
              iVar8 = iVar8 + 1;
              iVar7 = this_00->nCols;
            } while (iVar8 < iVar7);
          }
          pos = pos + 1;
        } while (pos < iVar17);
      }
      QTextDocumentPrivate::endEditBlock(this_01);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0053a703:
  __stack_chk_fail();
}

Assistant:

void QTextTable::removeRows(int pos, int num)
{
    Q_D(QTextTable);
//     qDebug() << "-------- removeRows" << pos << num;

    if (num <= 0 || pos < 0)
        return;
    if (d->dirty)
        d->update();
    if (pos >= d->nRows)
        return;
    if (pos+num > d->nRows)
        num = d->nRows - pos;

    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *collection = p->formatCollection();
    p->beginEditBlock();

    // delete whole table?
    if (pos == 0 && num == d->nRows) {
        const int pos = p->fragmentMap().position(d->fragment_start);
        p->remove(pos, p->fragmentMap().position(d->fragment_end) - pos + 1);
        p->endEditBlock();
        return;
    }

    p->aboutToRemoveCell(cellAt(pos, 0).firstPosition(), cellAt(pos + num - 1, d->nCols - 1).lastPosition());

    QList<int> touchedCells;
    for (int r = pos; r < pos + num; ++r) {
        for (int c = 0; c < d->nCols; ++c) {
            int cell = d->grid[r*d->nCols + c];
            if (touchedCells.contains(cell))
                continue;
            touchedCells << cell;
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = collection->charFormat(it->format);
            int span = fmt.tableCellRowSpan();
            if (span > 1) {
                fmt.setTableCellRowSpan(span - 1);
                p->setCharFormat(it.position(), 1, fmt);
            } else {
                // remove cell
                int index = d->cells.indexOf(cell) + 1;
                int f_end = index < d->cells.size() ? d->cells.at(index) : d->fragment_end;
                p->remove(it.position(), p->fragmentMap().position(f_end) - it.position());
            }
        }
    }

    p->endEditBlock();
//     qDebug() << "-------- end removeRows" << pos << num;
}